

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

void absl::lts_20250127::UnrefSynchEvent(SynchEvent *e)

{
  int iVar1;
  
  if (e != (SynchEvent *)0x0) {
    base_internal::SpinLock::Lock((SpinLock *)&synch_event_mu);
    e->refcount = e->refcount + -1;
    iVar1 = e->refcount;
    base_internal::SpinLock::Unlock((SpinLock *)&synch_event_mu);
    if (iVar1 == 0) {
      base_internal::LowLevelAlloc::Free(e);
      return;
    }
  }
  return;
}

Assistant:

static void UnrefSynchEvent(SynchEvent* e) {
  if (e != nullptr) {
    synch_event_mu.Lock();
    bool del = (--(e->refcount) == 0);
    synch_event_mu.Unlock();
    if (del) {
      base_internal::LowLevelAlloc::Free(e);
    }
  }
}